

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O3

bool iutest::internal::
     iuOperatorEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
               (vector<int,_std::allocator<int>_> *v1,vector<int,_std::allocator<int>_> *v2)

{
  pointer __s1;
  pointer piVar1;
  pointer __s2;
  int iVar2;
  size_t __n;
  
  __s1 = (v1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_start;
  piVar1 = (v1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  __n = (long)piVar1 - (long)__s1;
  __s2 = (v2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_start;
  if (__n != (long)(v2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)__s2) {
    return false;
  }
  if (piVar1 != __s1) {
    iVar2 = bcmp(__s1,__s2,__n);
    return iVar2 == 0;
  }
  return true;
}

Assistant:

bool iuOperatorEQ(const T1& v1, const T2& v2)
{
IUTEST_PRAGMA_WARN_PUSH()
IUTEST_PRAGMA_WARN_DISABLE_SIGN_COMPARE()
IUTEST_PRAGMA_WARN_DISABLE_IMPLICIT_INT_FLOAT_CONVERSION()
    return v1 == v2;
IUTEST_PRAGMA_WARN_POP()
}